

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim_rpc.hpp
# Opt level: O0

void __thiscall
nvim::NvimRPC::call<bool,bool>(NvimRPC *this,string *method,Integer *res,bool *u,bool *u_1)

{
  bool bVar1;
  int8_t iVar2;
  uint32_t uVar3;
  int64_t *piVar4;
  uint64_t *puVar5;
  ext *peVar6;
  void *pvVar7;
  char *pcVar8;
  ostream *poVar9;
  string local_88;
  undefined1 local_58 [8];
  Object v;
  bool *u_local_1;
  bool *u_local;
  Integer *res_local;
  string *method_local;
  NvimRPC *this_local;
  
  v.super_variant<_cf2d41c5_>.storage_.super_aligned_storage_imp<32UL,_8UL>.data_._24_8_ = u_1;
  do_call<bool,bool>((Object *)local_58,this,method,u,u_1);
  bVar1 = msgpack::v1::type::
          basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
          ::is_int64_t((basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                        *)local_58);
  if (bVar1) {
    piVar4 = msgpack::v1::type::
             basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
             ::as_int64_t((basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                           *)local_58);
    *res = *piVar4;
  }
  else {
    bVar1 = msgpack::v1::type::
            basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
            ::is_uint64_t((basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                           *)local_58);
    if (bVar1) {
      puVar5 = msgpack::v1::type::
               basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
               ::as_uint64_t((basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                              *)local_58);
      *res = *puVar5;
    }
    else {
      bVar1 = msgpack::v1::type::
              basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
              ::is_ext((basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                        *)local_58);
      if (bVar1) {
        type_name(&local_88,(Object *)local_58);
        poVar9 = std::operator<<((ostream *)&std::cout,(string *)&local_88);
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_88);
        peVar6 = msgpack::v1::type::
                 basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                 ::as_ext((basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                           *)local_58);
        iVar2 = msgpack::v1::type::ext::type(peVar6);
        pvVar7 = (void *)std::ostream::operator<<(&std::cout,(int)iVar2);
        std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
        peVar6 = msgpack::v1::type::
                 basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                 ::as_ext((basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                           *)local_58);
        uVar3 = msgpack::v1::type::ext::size(peVar6);
        pvVar7 = (void *)std::ostream::operator<<(&std::cout,uVar3);
        std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
        peVar6 = msgpack::v1::type::
                 basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                 ::as_ext((basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                           *)local_58);
        pcVar8 = msgpack::v1::type::ext::data(peVar6);
        *res = (long)(int)*pcVar8;
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cout,"invalid response type");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  msgpack::v1::type::
  basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
  ::~basic_variant((basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                    *)local_58);
  return;
}

Assistant:

void NvimRPC::call(const std::string &method, Integer& res, const U& ...u) {
    Object v = do_call(method, u...);
    // std::cout << "Integer NvimRPC::call" << std::endl;

    // int64_t is only for negative integer.
    if(v.is_int64_t())       res = v.as_int64_t();
    else if(v.is_uint64_t()) res = v.as_uint64_t();
    else if (v.is_ext()) {
        // NOTE: Buffer: 0; Tabpage: 2; Window: 1
        std::cout << type_name(v) << std::endl;
        std::cout << int(v.as_ext().type()) << std::endl;
        std::cout << v.as_ext().size() << std::endl;
        res = int(v.as_ext().data()[0]);
    }
    else std::cout << "invalid response type" << std::endl; //TODO: add error handler
}